

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# setup_common.cpp
# Opt level: O0

void __thiscall
TestChain100Setup::TestChain100Setup(TestChain100Setup *this,ChainType chain_type,TestOpts *opts)

{
  bool bVar1;
  CKey *this_00;
  AnnotatedMixin<std::recursive_mutex> *mutexIn;
  AnnotatedMixin<std::recursive_mutex> *pAVar2;
  CBlockIndex *this_01;
  long in_RDI;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *this_02;
  TestChain100Setup *this_03;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock27;
  array<unsigned_char,_32UL> vchKey;
  ChainstateManager *in_stack_fffffffffffffed8;
  undefined7 in_stack_fffffffffffffee0;
  undefined1 in_stack_fffffffffffffee7;
  TestOpts *in_stack_fffffffffffffee8;
  undefined8 in_stack_fffffffffffffef0;
  undefined1 fCompressedIn;
  uchar *in_stack_fffffffffffffef8;
  uchar *pbegin;
  uchar local_28 [16];
  TestOpts *in_stack_ffffffffffffffe8;
  undefined8 in_stack_fffffffffffffff0;
  ChainType chainType;
  TestingSetup *this_04;
  
  fCompressedIn = (undefined1)((ulong)in_stack_fffffffffffffef0 >> 0x38);
  chainType = (ChainType)((ulong)in_stack_fffffffffffffff0 >> 0x20);
  this_04 = *(TestingSetup **)(in_FS_OFFSET + 0x28);
  TestOpts::TestOpts(in_stack_fffffffffffffee8,
                     (TestOpts *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0));
  TestingSetup::TestingSetup(this_04,chainType,in_stack_ffffffffffffffe8);
  TestOpts::~TestOpts((TestOpts *)in_stack_fffffffffffffed8);
  this_02 = (UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)(in_RDI + 0x488);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)in_stack_fffffffffffffed8);
  this_03 = (TestChain100Setup *)(in_RDI + 0x4a0);
  CKey::CKey((CKey *)in_stack_fffffffffffffed8);
  SetMockTime((int64_t)in_stack_fffffffffffffed8);
  local_28[0] = '\0';
  local_28[1] = '\0';
  local_28[2] = '\0';
  local_28[3] = '\0';
  local_28[4] = '\0';
  local_28[5] = '\0';
  local_28[6] = '\0';
  local_28[7] = '\0';
  local_28[8] = '\0';
  local_28[9] = '\0';
  local_28[10] = '\0';
  local_28[0xb] = '\0';
  local_28[0xc] = '\0';
  local_28[0xd] = '\0';
  local_28[0xe] = '\0';
  local_28[0xf] = '\0';
  this_00 = (CKey *)(in_RDI + 0x4a0);
  pbegin = local_28;
  mutexIn = (AnnotatedMixin<std::recursive_mutex> *)
            std::array<unsigned_char,_32UL>::begin
                      ((array<unsigned_char,_32UL> *)in_stack_fffffffffffffed8);
  std::array<unsigned_char,_32UL>::end((array<unsigned_char,_32UL> *)in_stack_fffffffffffffed8);
  CKey::Set<unsigned_char_const*>(this_00,pbegin,in_stack_fffffffffffffef8,(bool)fCompressedIn);
  mineBlocks(this_03,(int)((ulong)this_02 >> 0x20));
  pAVar2 = MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
                     ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffed8);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (this_02,mutexIn,&this_00->fCompressed,(char *)pbegin,(int)((ulong)pAVar2 >> 0x20),
             SUB81((ulong)pAVar2 >> 0x18,0));
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
             in_stack_fffffffffffffed8);
  ChainstateManager::ActiveChain(in_stack_fffffffffffffed8);
  this_01 = CChain::Tip((CChain *)in_stack_fffffffffffffee8);
  CBlockIndex::GetBlockHash(this_01);
  base_blob<256u>::ToString_abi_cxx11_
            ((base_blob<256U> *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0));
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          this_01,(char *)CONCAT17(in_stack_fffffffffffffee7,
                                                   in_stack_fffffffffffffee0));
  if (!bVar1) {
    __assert_fail("m_node.chainman->ActiveChain().Tip()->GetBlockHash().ToString() == \"571d80a9967ae599cec0448b0b0ba1cfb606f584d8069bd7166b86854ba7a191\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/setup_common.cpp"
                  ,0x161,"TestChain100Setup::TestChain100Setup(const ChainType, TestOpts)");
  }
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffed8);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffed8);
  if (*(TestingSetup **)(in_FS_OFFSET + 0x28) == this_04) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

TestChain100Setup::TestChain100Setup(
    const ChainType chain_type,
    TestOpts opts)
    : TestingSetup{ChainType::REGTEST, opts}
{
    SetMockTime(1598887952);
    constexpr std::array<unsigned char, 32> vchKey = {
        {0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 1}};
    coinbaseKey.Set(vchKey.begin(), vchKey.end(), true);

    // Generate a 100-block chain:
    this->mineBlocks(COINBASE_MATURITY);

    {
        LOCK(::cs_main);
        assert(
            m_node.chainman->ActiveChain().Tip()->GetBlockHash().ToString() ==
            "571d80a9967ae599cec0448b0b0ba1cfb606f584d8069bd7166b86854ba7a191");
    }
}